

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::clear
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this,bool dispose)

{
  int *__ptr;
  int *piVar1;
  long lVar2;
  
  __ptr = (this->heap).data;
  if ((this->heap).sz < 1) {
    if (__ptr == (int *)0x0) {
      return;
    }
  }
  else {
    piVar1 = (this->indices).map.data;
    lVar2 = 0;
    do {
      if ((this->indices).map.sz <= __ptr[lVar2]) {
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x28,
                      "V &Minisat::IntMap<int, int>::operator[](K) [K = int, V = int, MkIndex = Minisat::MkIndexDefault<int>]"
                     );
      }
      piVar1[__ptr[lVar2]] = -1;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->heap).sz);
  }
  (this->heap).sz = 0;
  if (dispose) {
    free(__ptr);
    (this->heap).data = (int *)0x0;
    (this->heap).cap = 0;
  }
  return;
}

Assistant:

void clear(bool dispose = false) 
    { 
        // TODO: shouldn't the 'indices' map also be dispose-cleared?
        for (int i = 0; i < heap.size(); i++)
            indices[heap[i]] = -1;
        heap.clear(dispose); 
    }